

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cymric.cpp
# Opt level: O2

int cymric_random(cymric_rng *R,void *buffer,int bytes)

{
  uint32_t uVar1;
  uint uVar2;
  int iVar3;
  blake2b_state state;
  blake2b_state bStack_200;
  
  if (0 < bytes && (buffer != (void *)0x0 && R != (cymric_rng *)0x0)) {
    iVar3 = -2;
    if ((((R->internal[0x40] == 'S') && (R->internal[0x41] == 'E')) && (R->internal[0x42] == 'E'))
       && (R->internal[0x43] == 'D')) {
      uVar1 = GetCPUCycles();
      *(uint *)(R->internal + 0x20) = *(uint *)(R->internal + 0x20) ^ uVar1;
      uVar1 = unix_gettid();
      *(uint *)(R->internal + 0x24) = *(uint *)(R->internal + 0x24) ^ uVar1;
      LOCK();
      UNLOCK();
      uVar2 = (int)m_counter.super___atomic_base<unsigned_int>._M_i + 1;
      m_counter.super___atomic_base<unsigned_int>._M_i =
           (__atomic_base<unsigned_int>)
           (__atomic_base<unsigned_int>)(m_counter.super___atomic_base<unsigned_int>._M_i + 1)._M_i;
      *(uint *)(R->internal + 0x20) =
           *(int *)(R->internal + 0x20) + (uVar2 >> 0x13 | uVar2 * 0x2000);
      chacha((chacha_key *)R,(chacha_iv *)(R->internal + 0x20),(uint8_t *)buffer,(uint8_t *)buffer,
             (ulong)(uint)bytes,0xc);
      uVar1 = GetCPUCycles();
      *(uint32_t *)(R->internal + 0x24) = *(int *)(R->internal + 0x24) + uVar1;
      iVar3 = blake2b_init(&bStack_200,'@');
      if (iVar3 == 0) {
        iVar3 = blake2b_update(&bStack_200,(uint8_t *)R,0x40);
        if (iVar3 == 0) {
          iVar3 = blake2b_final(&bStack_200,(uint8_t *)R,'@');
          if (iVar3 == 0) {
            secure_zero_memory(bStack_200.buf,0x100);
            iVar3 = 0;
          }
          else {
            iVar3 = -5;
          }
        }
        else {
          iVar3 = -4;
        }
      }
      else {
        iVar3 = -3;
      }
    }
    return iVar3;
  }
  return -1;
}

Assistant:

int cymric_random(
    cymric_rng* R,  ///< [in] Generator to use
    void* buffer,   ///< [in, out] Buffer to fill with random bytes
    int bytes       ///< [in] Number of bytes to fill
) {
    static const int CHACHA_ROUNDS = 12;

    // Validate input
    if (!R || !buffer || bytes <= 0)
        return -1;

    // If R was not seeded:
    if (R->internal[64] != 'S' || R->internal[65] != 'E' ||
        R->internal[66] != 'E' || R->internal[67] != 'D') {
        return -2;
    }

    // Use low 32 bytes as a key for ChaCha20
    chacha_key *key = (chacha_key *)R->internal;

    // Use next 8 bytes as an IV for ChaCha20, reserving the top 24 bytes
    chacha_iv *iv = (chacha_iv *)(R->internal + 32);

    // Mix in some fast entropy sources
    uint32_t *iv_mix = (uint32_t *)iv;

#ifdef CYMRIC_CYCLES
    {
        // Mix in initial cycle count
        iv_mix[0] ^= GetCPUCycles();
    }
#endif

#ifndef CYMRIC_UNINIT
    CAT_MEMCLR(buffer, bytes);
#endif

#ifdef CYMRIC_GETTID
    {
        // Mix in thread id
        iv_mix[1] ^= unix_gettid();
    }
#endif

#ifdef CYMRIC_WINTID
    {
        // Mix in thread id
        iv_mix[1] ^= GetCurrentThreadId();
    }
#endif

#ifdef CYMRIC_PTHREADS
    {
        // Mix in pthread self id
        pthread_t myself = pthread_self();
        const uint32_t *words = (const uint32_t *)&myself;
        iv_mix[1] ^= words[0];
        if (sizeof(myself) > 4) {
            iv_mix[0] += words[1];
        }
    }
#endif

#ifdef CYMRIC_COUNTER
    {
        // Mix in incrementing counter
        const uint32_t c0 = get_counter();
        iv_mix[0] += CAT_ROL32(c0, 13);
    }
#endif

    // Note this is "encrypting" the uninitialized buffer with random
    // bytes from the ChaCha20 function.  Valgrind is not going to like
    // this but it is intentional
    chacha(key, iv, (const uint8_t *)buffer, (uint8_t *)buffer, bytes, CHACHA_ROUNDS);

#ifdef CYMRIC_CYCLES
    {
        // Mix in final cycle count
        iv_mix[1] += GetCPUCycles();
    }
#endif

    blake2b_state state;

    // Iterate the hash to erase the ChaCha20 key material
    if (blake2b_init(&state, 64))
        return -3;
    if (blake2b_update(&state, (const uint8_t *)R->internal, 64))
        return -4;
    if (blake2b_final(&state, (uint8_t *)R->internal, 64))
        return -5;

    CAT_SECURE_OBJCLR(state.buf);

    return 0;
}